

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_seterrorobj(lua_State *L,int errcode,StkId oldtop)

{
  long lVar1;
  TString *pTVar2;
  TValue *io2;
  TValue *io1;
  TString *x__1;
  TValue *io_1;
  TString *x_;
  TValue *io;
  StkId oldtop_local;
  int errcode_local;
  lua_State *L_local;
  
  if (errcode == 0) {
    (oldtop->val).tt_ = '\0';
  }
  else if (errcode == 4) {
    pTVar2 = L->l_G->memerrmsg;
    (oldtop->val).value_.gc = (GCObject *)pTVar2;
    (oldtop->val).tt_ = pTVar2->tt | 0x40;
  }
  else if (errcode == 5) {
    pTVar2 = luaS_newlstr(L,"error in error handling",0x17);
    *(TString **)oldtop = pTVar2;
    (oldtop->val).tt_ = pTVar2->tt | 0x40;
  }
  else {
    lVar1 = (L->top).offset;
    (oldtop->val).value_ = *(Value *)(lVar1 + -0x10);
    (oldtop->val).tt_ = *(lu_byte *)(lVar1 + -8);
  }
  (L->top).p = oldtop + 1;
  return;
}

Assistant:

void luaD_seterrorobj (lua_State *L, int errcode, StkId oldtop) {
  switch (errcode) {
    case LUA_ERRMEM: {  /* memory error? */
      setsvalue2s(L, oldtop, G(L)->memerrmsg); /* reuse preregistered msg. */
      break;
    }
    case LUA_ERRERR: {
      setsvalue2s(L, oldtop, luaS_newliteral(L, "error in error handling"));
      break;
    }
    case LUA_OK: {  /* special case only for closing upvalues */
      setnilvalue(s2v(oldtop));  /* no error message */
      break;
    }
    default: {
      lua_assert(errorstatus(errcode));  /* real error */
      setobjs2s(L, oldtop, L->top.p - 1);  /* error message on current top */
      break;
    }
  }
  L->top.p = oldtop + 1;
}